

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_default_catalog.cpp
# Opt level: O0

void ConcurrentDefaultCatalog::QueryDefaultCatalogFunctions
               (DuckDB *db,bool *read_correct,int thread_id)

{
  byte bVar1;
  undefined1 *in_RSI;
  DuckDB *in_RDI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  idx_t i;
  Connection con;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  random_queries;
  allocator_type *in_stack_fffffffffffffac8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffad0;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffad8;
  string *local_4d8;
  string local_368 [8];
  ulong local_360;
  Connection local_358 [38];
  undefined1 local_332;
  allocator local_331;
  allocator local_330;
  allocator local_32f;
  allocator local_32e;
  allocator local_32d;
  allocator local_32c;
  allocator local_32b;
  allocator local_32a;
  allocator local_329;
  allocator local_328;
  allocator local_327;
  allocator local_326;
  allocator local_325;
  allocator local_324;
  allocator local_323;
  allocator local_322;
  allocator local_321;
  allocator local_320;
  allocator local_31f;
  allocator local_31e;
  allocator local_31d [20];
  allocator local_309;
  string *local_308;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string *local_40;
  undefined8 local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  undefined1 *local_10;
  DuckDB *local_8;
  
  local_332 = 1;
  local_308 = local_300;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"SELECT pg_collation_is_visible(0)",&local_309);
  local_308 = local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"SELECT pg_conversion_is_visible(0)",local_31d);
  local_308 = local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"SELECT pg_function_is_visible(0)",&local_31e);
  local_308 = local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"SELECT pg_opclass_is_visible(0)",&local_31f);
  local_308 = local_280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"SELECT pg_operator_is_visible(0)",&local_320);
  local_308 = local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"SELECT pg_opfamily_is_visible(0)",&local_321);
  local_308 = local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"SELECT pg_table_is_visible(0)",&local_322);
  local_308 = local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"SELECT pg_ts_config_is_visible(0)",&local_323);
  local_308 = local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"SELECT pg_ts_dict_is_visible(0)",&local_324);
  local_308 = local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"SELECT pg_ts_parser_is_visible(0)",&local_325);
  local_308 = local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"SELECT pg_ts_template_is_visible(0)",&local_326);
  local_308 = local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"SELECT pg_type_is_visible(0)",&local_327);
  local_308 = local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"SELECT current_user",&local_328);
  local_308 = local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"SELECT current_catalog",&local_329);
  local_308 = local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"SELECT current_database()",&local_32a);
  local_308 = local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"SELECT user",&local_32b);
  local_308 = local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"SELECT session_user",&local_32c);
  local_308 = local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"SELECT inet_client_addr()",&local_32d);
  local_308 = local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"SELECT inet_client_port()",&local_32e);
  local_308 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"SELECT inet_server_addr()",&local_32f);
  local_308 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"SELECT inet_server_port()",&local_330);
  local_308 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"SELECT pg_my_temp_schema()",&local_331);
  local_332 = 0;
  local_40 = local_300;
  local_38 = 0x16;
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x793202);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector(in_stack_fffffffffffffad0,in_stack_fffffffffffffad8,in_stack_fffffffffffffac8);
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x793233);
  local_4d8 = (string *)&local_40;
  do {
    local_4d8 = local_4d8 + -0x20;
    std::__cxx11::string::~string(local_4d8);
  } while (local_4d8 != local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::allocator<char>::~allocator((allocator<char> *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_32f);
  std::allocator<char>::~allocator((allocator<char> *)&local_32e);
  std::allocator<char>::~allocator((allocator<char> *)&local_32d);
  std::allocator<char>::~allocator((allocator<char> *)&local_32c);
  std::allocator<char>::~allocator((allocator<char> *)&local_32b);
  std::allocator<char>::~allocator((allocator<char> *)&local_32a);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::allocator<char>::~allocator((allocator<char> *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_327);
  std::allocator<char>::~allocator((allocator<char> *)&local_326);
  std::allocator<char>::~allocator((allocator<char> *)&local_325);
  std::allocator<char>::~allocator((allocator<char> *)&local_324);
  std::allocator<char>::~allocator((allocator<char> *)&local_323);
  std::allocator<char>::~allocator((allocator<char> *)&local_322);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::allocator<char>::~allocator((allocator<char> *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_31f);
  std::allocator<char>::~allocator((allocator<char> *)&local_31e);
  std::allocator<char>::~allocator((allocator<char> *)local_31d);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  duckdb::Connection::Connection(local_358,local_8);
  *local_10 = 1;
  for (local_360 = 0; local_360 < 10; local_360 = local_360 + 1) {
    rand();
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(&local_30);
    duckdb::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[](in_stack_fffffffffffffad0,(size_type)in_stack_fffffffffffffac8);
    duckdb::Connection::Query(local_368);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffad0);
    bVar1 = duckdb::BaseQueryResult::HasError();
    if ((bVar1 & 1) != 0) {
      *local_10 = 0;
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x7938c0);
  }
  duckdb::Connection::~Connection(local_358);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x7938f3);
  return;
}

Assistant:

static void QueryDefaultCatalogFunctions(DuckDB *db, bool *read_correct, int thread_id) {
		duckdb::vector<string> random_queries {
		    "SELECT pg_collation_is_visible(0)",
		    "SELECT pg_conversion_is_visible(0)",
		    "SELECT pg_function_is_visible(0)",
		    "SELECT pg_opclass_is_visible(0)",
		    "SELECT pg_operator_is_visible(0)",
		    "SELECT pg_opfamily_is_visible(0)",
		    "SELECT pg_table_is_visible(0)",
		    "SELECT pg_ts_config_is_visible(0)",
		    "SELECT pg_ts_dict_is_visible(0)",
		    "SELECT pg_ts_parser_is_visible(0)",
		    "SELECT pg_ts_template_is_visible(0)",
		    "SELECT pg_type_is_visible(0)",
		    "SELECT current_user",
		    "SELECT current_catalog",
		    "SELECT current_database()",
		    "SELECT user",
		    "SELECT session_user",
		    "SELECT inet_client_addr()",
		    "SELECT inet_client_port()",
		    "SELECT inet_server_addr()",
		    "SELECT inet_server_port()",
		    "SELECT pg_my_temp_schema()",
		};

		Connection con(*db);
		*read_correct = true;
		for (idx_t i = 0; i < CONCURRENT_DEFAULT_ITERATION_COUNT; i++) {
			auto result = con.Query(random_queries[rand() % random_queries.size()]);
			if (result->HasError()) {
				*read_correct = false;
			}
		}
	}